

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O0

json helics::fileops::loadJson(string *jsonString)

{
  byte bVar1;
  size_type sVar2;
  json_value extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 in_RDI;
  json jVar4;
  parse_error *errs;
  ifstream file;
  invalid_argument *anon_var_0;
  nullptr_t in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  string_view in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  parser_callback_t *in_stack_fffffffffffffe70;
  basic_ifstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe78;
  json_value jVar3;
  
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RSI);
  if (sVar2 < 0x81) {
    std::ifstream::ifstream(&stack0xfffffffffffffdc0,(string *)in_RSI,_S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd50);
      loadJsonStr_abi_cxx11_(in_stack_fffffffffffffdc0);
    }
    else {
      CLI::std::
      function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
      ::function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                  *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::parse<std::ifstream&>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,(bool)in_stack_fffffffffffffe6f
                 ,(bool)in_stack_fffffffffffffe6e);
      CLI::std::
      function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
      ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                   *)0x7150f4);
    }
    std::ifstream::~ifstream(&stack0xfffffffffffffdc0);
    jVar3 = extraout_RDX;
  }
  else {
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd50);
    jVar4 = loadJsonStr_abi_cxx11_(in_stack_fffffffffffffdc0);
    jVar3 = jVar4.m_data.m_value;
  }
  jVar4.m_data.m_value.string = jVar3.string;
  jVar4.m_data._0_8_ = in_RDI;
  return (json)jVar4.m_data;
}

Assistant:

nlohmann::json loadJson(const std::string& jsonString)
{
    if (jsonString.size() > 128) {
        try {
            return loadJsonStr(jsonString);
        }
        catch (const std::invalid_argument&) {
            // this was a guess lets try a file now, the same error will be generated again later as
            // well
        }
    }
    std::ifstream file(jsonString);

    if (file.is_open()) {
        try {
            return nlohmann::json::parse(file, nullptr, true, true);
        }
        catch (const nlohmann::json::parse_error& errs) {
            throw(std::invalid_argument(errs.what()));
        }
    }
    return loadJsonStr(jsonString);
}